

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O0

int ludp_send(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  void *buffer_00;
  int err;
  void *buffer;
  char *pcStack_28;
  int sz;
  char *address;
  skynet_context *psStack_18;
  int id;
  skynet_context *ctx;
  lua_State *L_local;
  
  ctx = (skynet_context *)L;
  psStack_18 = (skynet_context *)lua_touserdata(L,-0xf4629);
  lVar2 = luaL_checkinteger((lua_State *)ctx,1);
  address._4_4_ = (int)lVar2;
  pcStack_28 = luaL_checklstring((lua_State *)ctx,2,(size_t *)0x0);
  buffer._4_4_ = 0;
  buffer_00 = get_buffer((lua_State *)ctx,3,(int *)((long)&buffer + 4));
  iVar1 = skynet_socket_udp_send(psStack_18,address._4_4_,pcStack_28,buffer_00,buffer._4_4_);
  lua_pushboolean((lua_State *)ctx,(uint)((iVar1 != 0 ^ 0xffU) & 1));
  return 1;
}

Assistant:

static int
ludp_send(lua_State *L) {
	struct skynet_context * ctx = lua_touserdata(L, lua_upvalueindex(1));
	int id = luaL_checkinteger(L, 1);
	const char * address = luaL_checkstring(L, 2);
	int sz = 0;
	void *buffer = get_buffer(L, 3, &sz);
	int err = skynet_socket_udp_send(ctx, id, address, buffer, sz);

	lua_pushboolean(L, !err);

	return 1;
}